

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFGsContainer.cpp
# Opt level: O2

set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> * __thiscall
CFGsContainer::cfgs(set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *__return_storage_ptr__,
                   CFGsContainer *this)

{
  _Base_ptr p_Var1;
  value_type local_40;
  insert_iterator<std::set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_>_> local_38;
  
  local_38.iter._M_node = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       local_38.iter._M_node;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       local_38.iter._M_node;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_38.container = __return_storage_ptr__;
  for (p_Var1 = (this->m_cfgsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_cfgsMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    local_40 = (value_type)p_Var1[1]._M_parent;
    std::insert_iterator<std::set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_>_>::operator=
              (&local_38,&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<CFG*> CFGsContainer::cfgs() const {
	std::set<CFG*> cfgs;

	std::transform(m_cfgsMap.begin(), m_cfgsMap.end(),
		std::inserter(cfgs, cfgs.begin()),
		[](const std::map<Addr, CFG*>::value_type &pair) {
			return pair.second;
		}
	);

	return cfgs;
}